

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O0

void MixUpdatePK(DuckDB *db,idx_t thread_idx)

{
  result_type rVar1;
  string *result_str;
  DuckDB *in_RDI;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  idx_t new_value;
  idx_t old_value;
  idx_t i;
  Connection con;
  mt19937 gen;
  uniform_int_distribution<int> distribution;
  int in_stack_ffffffffffffeb28;
  int in_stack_ffffffffffffeb2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb30;
  undefined7 in_stack_ffffffffffffeb38;
  byte in_stack_ffffffffffffeb3f;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffeb40;
  string local_14b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb68;
  string local_1490 [32];
  string local_1470 [32];
  string local_1450 [32];
  string local_1430 [32];
  string local_1410 [32];
  string local_13f0 [8];
  long local_13e8;
  ulong local_13c8;
  Connection local_13c0 [5048];
  DuckDB *local_8;
  
  local_8 = in_RDI;
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c,
             in_stack_ffffffffffffeb28);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x77de2b);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(in_stack_ffffffffffffeb40,CONCAT17(in_stack_ffffffffffffeb3f,in_stack_ffffffffffffeb38));
  duckdb::Connection::Connection(local_13c0,local_8);
  for (local_13c8 = 0; local_13c8 < 100; local_13c8 = local_13c8 + 1) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)in_stack_ffffffffffffeb30,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28));
    result_str = (string *)(long)rVar1;
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)in_stack_ffffffffffffeb30,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28));
    local_13e8 = (long)(rVar1 + 100);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffeb68);
    std::operator+((char *)CONCAT17(in_stack_ffffffffffffeb3f,in_stack_ffffffffffffeb38),
                   in_stack_ffffffffffffeb30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffeb3f,in_stack_ffffffffffffeb38),
                   (char *)in_stack_ffffffffffffeb30);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffeb68);
    std::operator+(in_stack_ffffffffffffeb68,in_stack_ffffffffffffeb60);
    duckdb::Connection::Query(local_13f0);
    std::__cxx11::string::~string(local_1410);
    std::__cxx11::string::~string(local_1490);
    std::__cxx11::string::~string(local_1430);
    std::__cxx11::string::~string(local_1450);
    std::__cxx11::string::~string(local_1470);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)in_stack_ffffffffffffeb30);
    in_stack_ffffffffffffeb3f = duckdb::BaseQueryResult::HasError();
    if ((in_stack_ffffffffffffeb3f & 1) != 0) {
      in_stack_ffffffffffffeb30 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           duckdb::
           unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)in_stack_ffffffffffffeb30);
      (**(code **)(*(long *)in_stack_ffffffffffffeb30 + 0x20))(local_14b0);
      CheckConstraintViolation(result_str);
      std::__cxx11::string::~string(local_14b0);
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x77e11c);
  }
  duckdb::Connection::~Connection(local_13c0);
  return;
}

Assistant:

static void MixUpdatePK(DuckDB *db, idx_t thread_idx) {

	std::uniform_int_distribution<> distribution(1, 100);
	std::mt19937 gen;
	gen.seed(thread_idx);

	Connection con(*db);
	for (idx_t i = 0; i < 100; i++) {

		idx_t old_value = distribution(gen);
		idx_t new_value = 100 + distribution(gen);

		auto result =
		    con.Query("UPDATE integers SET i =" + to_string(new_value) + " WHERE i = " + to_string(old_value));
		if (result->HasError()) {
			CheckConstraintViolation(result->ToString());
		}
	}
}